

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disasm.cpp
# Opt level: O2

Section * __thiscall
Disasm::disasmUntilJump
          (Section *__return_storage_ptr__,Disasm *this,ROMAddress *start,uint maxInstructions)

{
  byte bVar1;
  bool bVar2;
  uint8_t *data;
  int iVar3;
  Instruction inst;
  Instruction local_35;
  
  (__return_storage_ptr__->instructions).
  super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->instructions).
  super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->instructions).
  super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->start = start;
  iVar3 = maxInstructions + 1;
  do {
    iVar3 = iVar3 + -1;
    if (iVar3 == 0) break;
    data = SNESROM::operator[](&this->m_ROM,start);
    Instruction::Instruction(&local_35,&this->m_State,data);
    std::vector<Instruction,_std::allocator<Instruction>_>::push_back
              (&__return_storage_ptr__->instructions,&local_35);
    bVar1 = Instruction::size(&local_35);
    ROMAddress::operator+=(start,(uint)bVar1);
    bVar2 = Instruction::isJump(&local_35);
  } while (!bVar2);
  __return_storage_ptr__->end = start;
  return __return_storage_ptr__;
}

Assistant:

Disasm::Section Disasm::disasmUntilJump(ROMAddress* start, unsigned int maxInstructions) const {
    Section section;
    section.start = start;
    ROMAddress* pos = start;

    for(unsigned int i = 0; i < maxInstructions; ++i) {
        Instruction inst(m_State, m_ROM[pos]);
        section.instructions.push_back(inst);
        (*pos) += inst.size();

        if(inst.isJump()) {
            break;
        }
    }

    section.end = pos;

    return section;
}